

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_less_iter::operator()
          (_Iter_less_iter *this,pair<crnlib::vec<6U,_float>,_unsigned_int> *__it1,
          pair<crnlib::vec<6U,_float>,_unsigned_int> *__it2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  fVar1 = (__it1->first).m_s[0];
  fVar2 = (__it2->first).m_s[0];
  bVar5 = true;
  if (fVar2 <= fVar1) {
    if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_00180c2c;
        fVar3 = (__it1->first).m_s[uVar6 + 1];
        fVar4 = (__it2->first).m_s[uVar6 + 1];
        if (fVar3 < fVar4) {
          uVar7 = 1;
          goto LAB_00180c2c;
        }
      } while ((fVar3 == fVar4) && (uVar7 = uVar6 + 1, !NAN(fVar3) && !NAN(fVar4)));
      uVar7 = 0;
LAB_00180c2c:
      if ((uVar6 < 5 & (byte)uVar7) != 0) {
        return true;
      }
    }
    if (fVar1 <= fVar2) {
      if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
LAB_00180c7f:
        return __it1->second < __it2->second;
      }
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        uVar7 = uVar6;
        if (uVar6 == 5) goto LAB_00180c74;
        fVar1 = (__it2->first).m_s[uVar6 + 1];
        fVar2 = (__it1->first).m_s[uVar6 + 1];
        if (fVar1 < fVar2) {
          uVar7 = 1;
          goto LAB_00180c74;
        }
      } while ((fVar1 == fVar2) && (uVar7 = uVar6 + 1, !NAN(fVar1) && !NAN(fVar2)));
      uVar7 = 0;
LAB_00180c74:
      if ((uVar6 < 5 & (byte)uVar7) == 0) goto LAB_00180c7f;
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool operator<(const vec& rhs) const
        {
            for (uint i = 0; i < N; i++)
            {
                if (m_s[i] < rhs.m_s[i])
                {
                    return true;
                }
                else if (m_s[i] != rhs.m_s[i])
                {
                    return false;
                }
            }

            return false;
        }